

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O1

int Hop_ManCountLevels(Hop_Man_t *p)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  (p->pConst1->field_0).pData = (void *)0x0;
  pVVar5 = p->vPis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      *(undefined8 *)pVVar5->pArray[lVar4] = 0;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vPis;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = Hop_ManDfs(p);
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      plVar2 = (long *)pVVar5->pArray[lVar4];
      iVar3 = *(int *)(plVar2[3] & 0xfffffffffffffffe);
      if (*(int *)(plVar2[3] & 0xfffffffffffffffe) < *(int *)(plVar2[2] & 0xfffffffffffffffe)) {
        iVar3 = *(int *)(plVar2[2] & 0xfffffffffffffffe);
      }
      *plVar2 = (long)(int)((uint)((*(uint *)(plVar2 + 4) & 7) == 5) + iVar3 + 1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar5->nSize);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    free(pVVar5);
  }
  lVar4 = (long)p->vPos->nSize;
  if (lVar4 < 1) {
    iVar3 = 0;
  }
  else {
    lVar6 = 0;
    iVar3 = 0;
    do {
      iVar1 = *(int *)(*(ulong *)((long)p->vPos->pArray[lVar6] + 0x10) & 0xfffffffffffffffe);
      if (iVar3 <= iVar1) {
        iVar3 = iVar1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
  }
  return iVar3;
}

Assistant:

int Hop_ManCountLevels( Hop_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i, LevelsMax, Level0, Level1;
    // initialize the levels
    Hop_ManConst1(p)->pData = NULL;
    Hop_ManForEachPi( p, pObj, i )
        pObj->pData = NULL;
    // compute levels in a DFS order
    vNodes = Hop_ManDfs( p );
    Vec_PtrForEachEntry( Hop_Obj_t *, vNodes, pObj, i )
    {
        Level0 = (int)(ABC_PTRUINT_T)Hop_ObjFanin0(pObj)->pData;
        Level1 = (int)(ABC_PTRUINT_T)Hop_ObjFanin1(pObj)->pData;
        pObj->pData = (void *)(ABC_PTRUINT_T)(1 + Hop_ObjIsExor(pObj) + Abc_MaxInt(Level0, Level1));
    }
    Vec_PtrFree( vNodes );
    // get levels of the POs
    LevelsMax = 0;
    Hop_ManForEachPo( p, pObj, i )
        LevelsMax = Abc_MaxInt( LevelsMax, (int)(ABC_PTRUINT_T)Hop_ObjFanin0(pObj)->pData );
    return LevelsMax;
}